

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfok.c
# Opt level: O0

err_t pfokMTI(octet *sharekey,pfok_params *params,octet *privkey,octet *privkey1,octet *pubkey,
             octet *pubkey1)

{
  bool_t bVar1;
  int iVar2;
  void *n_00;
  ulong count;
  word *c;
  word *a;
  size_t sVar3;
  size_t sVar4;
  octet *mod;
  word *a_00;
  size_t *a_01;
  size_t *psVar5;
  qr_o *r;
  word wVar6;
  void *in_RCX;
  void *in_RDX;
  long *in_RSI;
  void *in_RDI;
  void *in_R8;
  void *in_R9;
  void *stack;
  qr_o *qr;
  word *v;
  word *y;
  word *u;
  word *x;
  void *state;
  size_t mo;
  size_t m;
  size_t no;
  size_t n;
  void *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  size_t *dest;
  pfok_params *in_stack_ffffffffffffff48;
  void *stack_00;
  void *l;
  size_t in_stack_ffffffffffffff60;
  size_t *a_02;
  qr_o *r_00;
  word *b;
  err_t local_4;
  
  bVar1 = memIsValid(in_RSI,0x2f8);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = pfokParamsIsOperable(in_stack_ffffffffffffff48);
    if (bVar1 == 0) {
      local_4 = 0x1f6;
    }
    else {
      n_00 = (void *)(*in_RSI + 0x3fU >> 6);
      count = *in_RSI + 7U >> 3;
      c = (word *)(in_RSI[1] + 0x3fU >> 6);
      a = (word *)(in_RSI[1] + 7U >> 3);
      bVar1 = memIsValid(in_RDX,(size_t)a);
      if ((((bVar1 != 0) && (bVar1 = memIsValid(in_RCX,(size_t)a), bVar1 != 0)) &&
          (bVar1 = memIsValid(in_R8,count), bVar1 != 0)) &&
         ((bVar1 = memIsValid(in_R9,count), bVar1 != 0 &&
          (bVar1 = memIsValid(in_RDI,in_RSI[2] + 7U >> 3), bVar1 != 0)))) {
        sVar3 = (long)n_00 * 0x10 + (long)c * 0x10;
        sVar4 = zmMontCreate_keep(count);
        mod = (octet *)(sVar3 + sVar4);
        sVar4 = zmMontCreate_deep(in_stack_ffffffffffffff60);
        stack_00 = n_00;
        l = n_00;
        zmMontCreate_deep(sVar4);
        sVar3 = qrPower_deep((size_t)stack_00,sVar3,in_stack_ffffffffffffff40);
        utilMax(2,sVar4,sVar3);
        a_00 = (word *)blobCreate((size_t)in_stack_ffffffffffffff38);
        if (a_00 == (word *)0x0) {
          return 0x6e;
        }
        r_00 = (qr_o *)(a_00 + (long)c);
        a_02 = &(r_00->hdr).keep + (long)c;
        a_01 = a_02 + (long)n_00;
        psVar5 = a_01 + (long)n_00;
        dest = psVar5;
        b = a_00;
        sVar3 = zmMontCreate_keep(count);
        r = (qr_o *)((long)dest + sVar3);
        zmMontCreate(r,mod,sVar4,(size_t)l,stack_00);
        u64From(dest,in_stack_ffffffffffffff38,0x16c5b9);
        u64From(dest,in_stack_ffffffffffffff38,0x16c5d0);
        wVar6 = wwGetBits(a_00,in_RSI[1],(long)c * 0x40 - in_RSI[1]);
        if ((wVar6 == 0) &&
           (wVar6 = wwGetBits((word *)r_00,in_RSI[1],(long)c * 0x40 - in_RSI[1]), wVar6 == 0)) {
          u64From(dest,in_stack_ffffffffffffff38,0x16c666);
          u64From(dest,in_stack_ffffffffffffff38,0x16c680);
          bVar1 = wwIsZero(a_02,(size_t)n_00);
          if ((bVar1 == 0) &&
             (((iVar2 = wwCmp(a_02,(word *)psVar5[3],(size_t)n_00), iVar2 < 0 &&
               (bVar1 = wwIsZero(a_01,(size_t)n_00), bVar1 == 0)) &&
              (iVar2 = wwCmp(a_01,(word *)psVar5[3],(size_t)n_00), iVar2 < 0)))) {
            qrPower(c,a,b,(size_t)a_00,r_00,a_02);
            qrPower(c,a,b,(size_t)a_00,r_00,a_02);
            (*(code *)psVar5[9])(a_02,a_02,psVar5,r);
            (*(code *)psVar5[9])(a_01,a_01,psVar5,r);
            memCopy(dest,in_stack_ffffffffffffff38,0x16c7b2);
            memXor2(in_RDI,a_01,in_RSI[2] + 7U >> 3);
            if ((in_RSI[2] & 7U) != 0) {
              *(byte *)((long)in_RDI + ((ulong)in_RSI[2] >> 3)) =
                   *(byte *)((long)in_RDI + ((ulong)in_RSI[2] >> 3)) &
                   (byte)(0xff >> (8 - ((byte)in_RSI[2] & 7) & 0x1f));
            }
            blobClose((blob_t)0x16c83a);
            return 0;
          }
          blobClose((blob_t)0x16c6f8);
          return 0x1f9;
        }
        blobClose((blob_t)0x16c63c);
        return 0x1f8;
      }
      local_4 = 0x6d;
    }
  }
  return local_4;
}

Assistant:

err_t pfokMTI(octet sharekey[], const pfok_params* params, 
	const octet privkey[], const octet privkey1[], 
	const octet pubkey[], const octet pubkey1[])
{
	size_t n, no;
	size_t m, mo;
	// состояние
	void* state;
	word* x;				/* [m] личный ключ */
	word* u;				/* [m] одноразовый личный ключ */
	word* y;				/* [n] открытый ключ визави */
	word* v;				/* [n] одноразовый открытый ключ визави */
	qr_o* qr;				/* описание кольца Монтгомери */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(pfok_params)))
		return ERR_BAD_INPUT;
	// работоспособные параметры?
	if (!pfokParamsIsOperable(params))
		return ERR_BAD_PARAMS;
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	// проверить остальные входные данные
	if (!memIsValid(privkey, mo) || 
		!memIsValid(privkey1, mo) || 
		!memIsValid(pubkey, no) ||
		!memIsValid(pubkey1, no) ||
		!memIsValid(sharekey, O_OF_B(params->n)))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(
		2 * O_OF_W(n) + 2 * O_OF_W(m) + zmMontCreate_keep(no) +  
		utilMax(2,
			zmMontCreate_deep(no),
			qrPower_deep(n, n, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	x = (word*)state;
	u = x + m;
	y = u + m;
	v = y + n;
	qr = (qr_o*)(v + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// x <- privkey, u <- privkey1
	wwFrom(x, privkey, mo);
	wwFrom(u, privkey1, mo);
	if (wwGetBits(x, params->r, B_OF_W(m) - params->r) != 0 ||
		wwGetBits(u, params->r, B_OF_W(m) - params->r) != 0)
	{
		blobClose(state);
		return ERR_BAD_PRIVKEY;
	}
	// y <- pubkey, v <- pubkey1
	wwFrom(y, pubkey, no);
	wwFrom(v, pubkey1, no);
	if (wwIsZero(y, n) || wwCmp(y, qr->mod, n) >= 0 ||
		wwIsZero(v, n) || wwCmp(v, qr->mod, n) >= 0)
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// y <- y^u, v <- v^x
	qrPower(y, y, u, m, qr, stack);
	qrPower(v, v, x, m, qr, stack);
	// выгрузить открытый ключ
	qrTo((octet*)y, y, qr, stack);
	qrTo((octet*)v, v, qr, stack);
	memCopy(sharekey, y, O_OF_B(params->n));
	memXor2(sharekey, v, O_OF_B(params->n));
	if (params->n % 8)
		sharekey[params->n / 8] &= (octet)255 >> (8 - params->n % 8);
	// все нормально
	blobClose(state);
	return ERR_OK;
}